

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O0

void ExchCXX::detail::host_eval_exc_helper_polar<ExchCXX::BuiltinPC07OPT_K>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps)

{
  double *in_RCX;
  double in_RDX;
  double in_RSI;
  int in_EDI;
  double unaff_retaddr;
  double in_stack_00000008;
  double lapl_i_b;
  double lapl_i_a;
  double *lapl_i;
  double *tau_i;
  double *sigma_i;
  double *rho_i;
  int32_t i;
  undefined4 local_34;
  undefined4 in_stack_fffffffffffffff8;
  
  for (local_34 = 0; local_34 < in_EDI; local_34 = local_34 + 1) {
    mgga_screening_interface<ExchCXX::BuiltinPC07OPT_K>::eval_exc_polar
              ((double)lapl_i,lapl_i_a,lapl_i_b,in_stack_00000008,unaff_retaddr,
               (double)CONCAT44(in_EDI,in_stack_fffffffffffffff8),in_RSI,in_RDX,(double)sigma_i,
               in_RCX);
  }
  return;
}

Assistant:

MGGA_EXC_GENERATOR( host_eval_exc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i   = rho   + 2*i;
    auto* sigma_i = sigma + 3*i;
    auto* tau_i   = tau   + 2*i;
    auto* lapl_i  = lapl  + 2*i;

    const auto lapl_i_a = traits::needs_laplacian ? lapl_i[0] : 0.0;
    const auto lapl_i_b = traits::needs_laplacian ? lapl_i[1] : 0.0;
   
    traits::eval_exc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], lapl_i_a, lapl_i_b, tau_i[0], tau_i[1], 
      eps[i] );

  }

}